

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonTests.cc
# Opt level: O2

void avro::json::testLong(TestData<long> *d)

{
  Entity *this;
  unit_test_log_t *this_00;
  Entity n;
  long *local_c0;
  Long local_b8;
  char *local_b0;
  char *local_a8;
  unit_test_log_t local_a0;
  undefined1 local_98;
  undefined8 *local_90;
  char *local_88;
  const_string local_80;
  const_string local_70;
  char *local_60;
  char *local_58;
  const_string local_50;
  const_string local_40;
  
  this = &n;
  avro::json::loadEntity((char *)&n);
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_40,0x51,&local_50);
  this_00 = &local_a0;
  local_98 = 0;
  local_a0.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001d6a20;
  local_90 = &boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_58 = "";
  local_b8 = CONCAT44(local_b8._4_4_,_n);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::json::EntityType,avro::json::EntityType>
            (this_00,&local_60,0x51,1,2,&local_b8,"n.type()",&d->type,"d.type");
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(this_00,&local_70,0x52,&local_80);
  local_98 = 0;
  local_a0.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001d6a20;
  local_90 = &boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_a8 = "";
  local_b8 = Entity::longValue(&n);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_a0,&local_b0,0x52,1,2,&local_b8,"n.longValue()",&d->value,"d.value");
  if (local_c0 != (long *)0x0) {
    (**(code **)(*local_c0 + 8))();
  }
  return;
}

Assistant:

void testLong(const TestData<int64_t>& d)
{
    Entity n = loadEntity(d.input);
    BOOST_CHECK_EQUAL(n.type(), d.type);
    BOOST_CHECK_EQUAL(n.longValue(), d.value);
}